

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitMap.cpp
# Opt level: O0

bool axl::sl::BitMap::isEqualImpl(size_t *p1,size_t count1,size_t *p2,size_t count2)

{
  int iVar1;
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  size_t i;
  ulong local_30;
  bool local_1;
  
  iVar1 = memcmp(in_RDI,in_RDX,in_RSI << 3);
  local_30 = in_RSI;
  if (iVar1 == 0) {
    for (; local_30 < in_RCX; local_30 = local_30 + 1) {
      if (*(long *)((long)in_RDX + local_30 * 8) != 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
BitMap::isEqualImpl(
	const size_t* p1,
	size_t count1,
	const size_t* p2,
 	size_t count2
) {
	ASSERT(count1 < count2);

	if (memcmp(p1, p2, count1 * sizeof(size_t)))
		return false;

	for (size_t i = count1; i < count2; i++)
		if (p2[i])
			return false;

	return true;
}